

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O0

void av1_fdct4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int8_t *in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [4];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  int32_t *local_48;
  int32_t *local_40;
  int local_34;
  int32_t *local_30;
  undefined4 local_24;
  int8_t *local_20;
  char local_11;
  int32_t *local_10;
  int32_t *local_8;
  
  local_24 = 4;
  local_34 = 0;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  av1_range_check_buf(0,in_RDI,in_RDI,4,*in_RCX);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = *local_8 + local_8[3];
  local_10[1] = local_8[1] + local_8[2];
  local_10[2] = local_8[1] - local_8[2];
  local_10[3] = *local_8 - local_8[3];
  av1_range_check_buf(local_34,local_8,local_10,4,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_48 = &local_58;
  iVar1 = half_btf(local_30[0x20],*local_10,local_30[0x20],local_10[1],(int)local_11);
  *local_48 = iVar1;
  iVar1 = half_btf(-local_30[0x20],local_40[1],local_30[0x20],*local_40,(int)local_11);
  local_48[1] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[2],local_30[0x10],local_40[3],(int)local_11);
  local_48[2] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[3],-local_30[0x10],local_40[2],(int)local_11);
  local_48[3] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,4,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_58;
  local_10[1] = local_50;
  local_10[2] = local_54;
  local_10[3] = local_4c;
  local_40 = &local_58;
  av1_range_check_buf(local_34,local_8,local_10,4,local_20[local_34]);
  return;
}

Assistant:

void av1_fdct4(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  const int32_t size = 4;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[4];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[3];
  bf1[1] = input[1] + input[2];
  bf1[2] = -input[2] + input[1];
  bf1[3] = -input[3] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[2];
  bf1[2] = bf0[1];
  bf1[3] = bf0[3];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}